

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

int float128_eq_quiet_aarch64(float128 a,float128 b,float_status *status)

{
  int iVar1;
  ulong uVar2;
  uint64_t uVar3;
  ulong uVar4;
  uint64_t uVar5;
  
  uVar4 = a.high;
  uVar5 = a.low;
  uVar2 = b.high;
  uVar3 = b.low;
  if ((((~uVar4 & 0x7fff000000000000) == 0) &&
      (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
       uVar5 != 0)) ||
     (((~uVar2 & 0x7fff000000000000) == 0 &&
      (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
       uVar3 != 0)))) {
    if ((((uVar4 & 0x7fff800000000000) == 0x7fff000000000000) &&
        (((undefined1  [16])a & (undefined1  [16])0x7fffffffffff) != (undefined1  [16])0x0 ||
         uVar5 != 0)) ||
       ((iVar1 = 0, (uVar2 & 0x7fff800000000000) == 0x7fff000000000000 &&
        (((undefined1  [16])b & (undefined1  [16])0x7fffffffffff) != (undefined1  [16])0x0 ||
         uVar3 != 0)))) {
      status->float_exception_flags = status->float_exception_flags | 1;
      return 0;
    }
  }
  else {
    iVar1 = 0;
    if (((uVar5 == uVar3) && (iVar1 = 1, uVar4 != uVar2)) && (iVar1 = 0, uVar5 == 0)) {
      return (int)(((uVar2 | uVar4) & 0x7fffffffffffffff) == 0);
    }
  }
  return iVar1;
}

Assistant:

int float128_eq_quiet(float128 a, float128 b, float_status *status)
{

    if (    (    ( extractFloat128Exp( a ) == 0x7FFF )
              && ( extractFloat128Frac0( a ) | extractFloat128Frac1( a ) ) )
         || (    ( extractFloat128Exp( b ) == 0x7FFF )
              && ( extractFloat128Frac0( b ) | extractFloat128Frac1( b ) ) )
       ) {
        if (float128_is_signaling_nan(a, status)
         || float128_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return 0;
    }
    return
           ( a.low == b.low )
        && (    ( a.high == b.high )
             || (    ( a.low == 0 )
                  && ( (uint64_t) ( ( a.high | b.high )<<1 ) == 0 ) )
           );

}